

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::SetIsThreadBound(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  HANDLE hSourceProcessHandle;
  HANDLE hSourceHandle;
  HANDLE hTargetProcessHandle;
  undefined8 *in_FS_OFFSET;
  void *local_40;
  ULONG_PTR highLimit;
  ULONG_PTR lowLimit;
  
  if (this->mainThreadHandle != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x234,"(mainThreadHandle == nullptr)","mainThreadHandle == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  hSourceProcessHandle = GetCurrentProcess();
  hSourceHandle = PAL_GetCurrentThread();
  hTargetProcessHandle = GetCurrentProcess();
  DuplicateHandle(hSourceProcessHandle,hSourceHandle,hTargetProcessHandle,&this->mainThreadHandle,0,
                  0,2);
  local_40 = (void *)0x0;
  highLimit = 0;
  GetCurrentThreadStackLimits(&highLimit,(ULONG_PTR *)&local_40);
  this->stackBase = local_40;
  return;
}

Assistant:

void
Recycler::SetIsThreadBound()
{
    Assert(mainThreadHandle == nullptr);
    ::DuplicateHandle(::GetCurrentProcess(), ::GetCurrentThread(), ::GetCurrentProcess(),  &mainThreadHandle,
        0, FALSE, DUPLICATE_SAME_ACCESS);

    stackBase = GetStackBase();
}